

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::SuperpositionConf::Lhs> __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::next(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
       *this)

{
  bool bVar1;
  Lhs *data;
  AbstractingUnifier *unifier;
  TermList in_RDI;
  TypedTermList TVar2;
  Renaming normalizer;
  Lhs *ld;
  Renaming *in_stack_ffffffffffffff68;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar3;
  SortId in_stack_ffffffffffffff90;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffffb8;
  QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::SuperpositionConf::Lhs> local_10;
  
  do {
    bVar1 = hasLeafData(in_stack_ffffffffffffff70);
    uVar3 = false;
    if (!bVar1) {
      uVar3 = findNextLeaf(in_stack_ffffffffffffffb8);
    }
  } while ((bool)uVar3 != false);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_>::operator->
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_> *)0x4a505b
            );
  data = Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>::next
                   ((VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*> *)0x4a5063);
  if ((*(byte *)(in_RDI._content + 0x58) & 1) != 0) {
    Kernel::Renaming::Renaming((Renaming *)in_stack_ffffffffffffff70);
    TVar2 = Kernel::SelectedEquality::key((SelectedEquality *)in_stack_ffffffffffffff90._content);
    TVar2._sort = TVar2._sort._content;
    TVar2._sort._content = in_stack_ffffffffffffff90._content;
    TVar2.super_TermList._content = in_RDI._content;
    Kernel::Renaming::normalizeVariables
              ((Renaming *)CONCAT17(uVar3,in_stack_ffffffffffffff80),TVar2);
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::bdRecord((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
                *)TVar2._sort._content,(BacktrackData *)in_stack_ffffffffffffff68);
    *(undefined1 *)(in_RDI._content + 0xb8) = 1;
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::denormalize((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
                   *)TVar2._sort._content,in_stack_ffffffffffffff68);
    Kernel::Renaming::~Renaming((Renaming *)0x4a50fc);
  }
  unifier = RetrievalAlgorithms::
            UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
            ::unifier((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
                       *)0x4a5122);
  QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::SuperpositionConf::Lhs>::QueryRes
            (&local_10,unifier,data);
  return local_10;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }